

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

WirehairResult __thiscall
wirehair::Codec::ReconstructOutput(Codec *this,void *message_out,uint64_t message_bytes)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t uVar3;
  uint uVar4;
  WirehairResult WVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  short sVar12;
  short sVar13;
  uint i;
  long lVar14;
  uint uVar15;
  PeelRow *pPVar16;
  ushort uVar17;
  uint uVar18;
  uint16_t peel_x;
  uint uVar19;
  uint8_t *puVar20;
  ulong uVar21;
  RowMixIterator mix;
  PeelRowParameters params;
  ushort local_58 [3];
  PeelRowParameters local_52;
  uint8_t *local_48;
  ulong local_40;
  ulong local_38;
  
  WVar5 = Wirehair_InvalidInput;
  if ((message_out != (void *)0x0) &&
     (WVar5 = Wirehair_InvalidInput,
     (this->_block_count - 1) * this->_block_bytes + this->_output_final_bytes == message_bytes)) {
    local_48 = this->_copied_original;
    memset(local_48,0,(ulong)this->_block_count);
    if (this->_row_count != 0) {
      puVar20 = this->_input_blocks;
      pPVar16 = this->_peel_rows;
      uVar17 = 0;
      do {
        uVar11 = pPVar16->RecoveryId;
        if (uVar11 < this->_block_count) {
          uVar6 = this->_block_bytes;
          if (uVar11 == this->_block_count - 1) {
            uVar6 = this->_output_final_bytes;
          }
          memcpy((void *)((ulong)(this->_block_bytes * uVar11) + (long)message_out),puVar20,
                 (ulong)uVar6);
          local_48[uVar11] = '\x01';
        }
        uVar17 = uVar17 + 1;
        pPVar16 = pPVar16 + 1;
        puVar20 = puVar20 + this->_block_bytes;
      } while (uVar17 < this->_row_count);
    }
    uVar17 = this->_block_count;
    uVar21 = (ulong)uVar17;
    WVar5 = Wirehair_Success;
    if (uVar17 != 0) {
      uVar11 = this->_block_bytes;
      local_38 = 0;
      uVar7 = uVar21;
      local_40 = uVar21;
      do {
        if (local_48[local_38] == '\0') {
          uVar7 = local_38 + 1;
          uVar6 = this->_output_final_bytes;
          PeelRowParameters::Initialize
                    (&local_52,(uint32_t)local_38,this->_p_seed,uVar17,this->_mix_count);
          uVar3 = local_52.PeelAdd;
          uVar4 = (uint)this->_block_next_prime;
          uVar19 = (uint)local_52.PeelFirst;
          uVar18 = (uint)local_52.PeelAdd;
          uVar1 = this->_mix_count;
          uVar2 = this->_mix_next_prime;
          uVar8 = (uint)local_52.MixFirst;
          local_58[0] = local_52.MixFirst;
          lVar14 = 1;
          uVar9 = uVar8;
          do {
            uVar9 = ((uVar9 & 0xffff) + (uint)local_52.MixAdd) % (uint)uVar2;
            if (uVar1 <= uVar9) {
              uVar9 = uVar2 - uVar9;
              uVar15 = uVar9 & 0xffff;
              if (local_52.MixAdd < (ushort)uVar9) {
                uVar9 = ((uint)local_52.MixAdd * 0x10000 - uVar15) % (uint)local_52.MixAdd;
              }
              else {
                uVar9 = local_52.MixAdd - uVar15;
              }
            }
            local_58[lVar14] = (ushort)uVar9;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          if (uVar7 == uVar21) {
            uVar11 = uVar6;
          }
          puVar20 = this->_recovery_blocks;
          uVar6 = this->_block_bytes;
          sVar13 = local_52.PeelCount - 1;
          uVar15 = (uint)uVar17;
          sVar12 = sVar13;
          uVar9 = uVar19;
          if (sVar13 != 0) {
            sVar12 = local_52.PeelCount - 2;
            uVar9 = (local_52.PeelAdd + uVar19) % uVar4;
            if (uVar15 <= uVar9) {
              uVar10 = uVar4 - uVar9 & 0xffff;
              if (local_52.PeelAdd < (ushort)(uVar4 - uVar9)) {
                uVar9 = (uVar18 * 0x10000 - uVar10) % uVar18;
              }
              else {
                uVar9 = uVar18 - uVar10;
              }
            }
          }
          if (sVar13 == 0) {
            gf256_addset_mem(message_out,puVar20 + uVar19 * uVar6,puVar20 + uVar6 * (uVar8 + uVar15)
                             ,uVar11);
          }
          else {
            gf256_addset_mem(message_out,puVar20 + uVar19 * uVar6,puVar20 + uVar6 * (uVar9 & 0xffff)
                             ,uVar11);
            while( true ) {
              sVar13 = sVar12;
              if (sVar12 != 0) {
                sVar13 = sVar12 + -1;
                uVar9 = ((uVar9 & 0xffff) + uVar18) % uVar4;
                if (uVar15 <= uVar9) {
                  uVar6 = uVar4 - uVar9 & 0xffff;
                  if (uVar3 < (ushort)(uVar4 - uVar9)) {
                    uVar9 = (uVar18 * 0x10000 - uVar6) % uVar18;
                  }
                  else {
                    uVar9 = uVar18 - uVar6;
                  }
                }
              }
              if (sVar12 == 0) break;
              gf256_add_mem(message_out,
                            this->_recovery_blocks + this->_block_bytes * (uVar9 & 0xffff),uVar11);
              sVar12 = sVar13;
            }
            gf256_add_mem(message_out,this->_recovery_blocks + this->_block_bytes * (uVar8 + uVar15)
                          ,uVar11);
          }
          gf256_add2_mem(message_out,
                         this->_recovery_blocks + (local_58[1] + uVar15) * this->_block_bytes,
                         this->_recovery_blocks + (local_58[2] + uVar15) * this->_block_bytes,uVar11
                        );
          uVar7 = local_40;
        }
        local_38 = local_38 + 1;
        message_out = (void *)((long)message_out + (ulong)this->_block_bytes);
      } while (local_38 != uVar7);
      WVar5 = Wirehair_Success;
    }
  }
  return WVar5;
}

Assistant:

WirehairResult Codec::ReconstructOutput(
    void * GF256_RESTRICT message_out,
    uint64_t message_bytes)
{
    CAT_IF_DUMP(cout << endl << "---- ReconstructOutput ----" << endl << endl;)

    // Validate input
    if (!message_out) {
        return Wirehair_InvalidInput;
    }
    if (message_bytes != _block_bytes * (_block_count - 1) + _output_final_bytes) {
        CAT_DEBUG_BREAK();
        return Wirehair_InvalidInput;
    }
    uint8_t * GF256_RESTRICT output_blocks = reinterpret_cast<uint8_t *>( message_out );

#if defined(CAT_COPY_FIRST_N)
    // Re-purpose and initialize an array to store whether or not each row id needs to be regenerated
    uint8_t * GF256_RESTRICT copied_original = _copied_original;
    memset(copied_original, 0, _block_count);

    // Copy any original message rows that were received
    const uint8_t * GF256_RESTRICT src = _input_blocks;
    PeelRow * GF256_RESTRICT row = _peel_rows;

    // For each row:
    for (uint16_t row_i = 0; row_i < _row_count; ++row_i, ++row, src += _block_bytes)
    {
        const uint32_t block_id = row->RecoveryId;

        // If the row identifier indicates it is part of the original message data:
        if (block_id < _block_count)
        {
            CAT_IF_DUMP(cout << "Copying received row " << id << endl;)

            uint8_t * GF256_RESTRICT dest = output_blocks + _block_bytes * block_id;
            const unsigned bytes = (block_id != (unsigned)_block_count - 1) ? _block_bytes : _output_final_bytes;

            memcpy(dest, src, bytes);

            copied_original[block_id] = 1;
        }
    }
#endif // CAT_COPY_FIRST_N

    // Regenerate any rows that got lost:

    uint8_t * GF256_RESTRICT dest = output_blocks;
    unsigned block_bytes = _block_bytes;

    // For each block to generate:
    const uint16_t block_count = _block_count;
    for (uint32_t block_id = 0; block_id < block_count; ++block_id, dest += _block_bytes)
    {
#if defined(CAT_COPY_FIRST_N)
        // If already copied, skip it
        if (copied_original[block_id]) {
            continue;
        }
#endif // CAT_COPY_FIRST_N
        // For last row, use final byte count
        if (block_id + 1 == block_count) {
            block_bytes = _output_final_bytes;
        }

        CAT_IF_DUMP(cout << "Regenerating row " << row_i << ":";)

        PeelRowParameters params;
        params.Initialize(block_id, _p_seed, block_count, _mix_count);

        PeelRowIterator iter(params, block_count, _block_next_prime);
        const RowMixIterator mix(params, _mix_count, _mix_next_prime);

        const uint16_t peel_0 = iter.GetColumn();

        // Remember first column (there is always at least one)
        CAT_DEBUG_ASSERT(peel_0 < _recovery_rows);
        const uint8_t * GF256_RESTRICT first = _recovery_blocks + _block_bytes * peel_0;

        CAT_IF_DUMP(cout << " " << peel_0;)

        // If peeler has multiple columns:
        if (iter.Iterate())
        {
            const uint16_t peel_1 = iter.GetColumn();

            CAT_IF_DUMP(cout << " " << peel_1;)

            // Combine first two columns into output buffer (faster than memcpy + memxor)
            CAT_DEBUG_ASSERT(peel_1 < _recovery_rows);
            gf256_addset_mem(dest, first, _recovery_blocks + _block_bytes * peel_1, block_bytes);

            // For each remaining peeler column:
            while (iter.Iterate())
            {
                const uint16_t peel_x = iter.GetColumn();

                CAT_IF_DUMP(cout << " " << peel_x;)

                // Mix in each column
                CAT_DEBUG_ASSERT(peel_x < _recovery_rows);
                gf256_add_mem(dest, _recovery_blocks + _block_bytes * peel_x, block_bytes);
            }

            // Mix first mixer block in directly
            CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[0]) < _recovery_rows);
            gf256_add_mem(dest, _recovery_blocks + _block_bytes * (block_count + mix.Columns[0]), block_bytes);
        }
        else
        {
            // Mix first with first mixer block (faster than memcpy + memxor)
            CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[0]) < _recovery_rows);
            gf256_addset_mem(dest, first, _recovery_blocks + _block_bytes * (block_count + mix.Columns[0]), block_bytes);
        }

        CAT_IF_DUMP(cout << " " << (block_count + mix.Columns[0]);)

        // Combine remaining two mixer columns together:
        CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[1]) < _recovery_rows);
        const uint8_t *mix0_src = _recovery_blocks + _block_bytes * (block_count + mix.Columns[1]);
        CAT_IF_DUMP(cout << " " << (block_count + mix.Columns[1]);)

        CAT_DEBUG_ASSERT((unsigned)(block_count + mix.Columns[2]) < _recovery_rows);
        const uint8_t *mix1_src = _recovery_blocks + _block_bytes * (block_count + mix.Columns[2]);
        CAT_IF_DUMP(cout << " " << (block_count + mix.Columns[2]);)

        gf256_add2_mem(dest, mix0_src, mix1_src, block_bytes);

        CAT_IF_DUMP(cout << endl;)
    } // next row

    return Wirehair_Success;
}